

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  ImFontAtlasCustomRect *pIVar5;
  float fVar6;
  float fVar7;
  float fVar9;
  ImVec2 IVar8;
  ImVec2 IVar10;
  float fVar12;
  ImVec2 IVar11;
  ImVec2 IVar13;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar10 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    pIVar5 = (this->CustomRects).Data + this->CustomRectIds[0];
    uVar1._0_2_ = pIVar5->X;
    uVar1._2_2_ = pIVar5->Y;
    uVar1._4_4_ = pIVar5->GlyphAdvanceX;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)((uint)uVar1._4_4_ >> 0x10);
    auVar3._8_2_ = (short)uVar1._4_4_;
    auVar3._0_8_ = uVar1;
    auVar3._10_4_ = auVar2._10_4_;
    auVar4._6_8_ = 0;
    auVar4._0_6_ = auVar3._8_6_;
    fVar7 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x +
            (float)(ushort)(undefined2)uVar1;
    fVar9 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y +
            (float)(int)CONCAT82(SUB148(auVar4 << 0x40,6),uVar1._2_2_);
    IVar8 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar10;
    IVar10.x = (this->TexUvScale).x * fVar7;
    IVar10.y = (this->TexUvScale).y * fVar9;
    *out_uv_border = IVar10;
    fVar6 = IVar8.x;
    fVar12 = fVar9 + IVar8.y;
    IVar13.x = (this->TexUvScale).x * (fVar7 + fVar6);
    IVar13.y = (this->TexUvScale).y * fVar12;
    out_uv_border[1] = IVar13;
    IVar8.x = (fVar7 + 109.0) * (this->TexUvScale).x;
    IVar8.y = fVar9 * (this->TexUvScale).y;
    *out_uv_fill = IVar8;
    IVar11.x = (fVar7 + 109.0 + fVar6) * (this->TexUvScale).x;
    IVar11.y = fVar12 * (this->TexUvScale).y;
    out_uv_fill[1] = IVar11;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    IM_ASSERT(r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}